

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void FrequencyTable(BSDF *bsdf,Vector3f *wo,RNG *rng,int sampleCount,int thetaRes,int phiRes,
                   Float *target)

{
  undefined1 auVar1 [16];
  Vector3f v;
  bool bVar2;
  BSDFSample *pBVar3;
  int *piVar4;
  int in_ECX;
  long lVar5;
  float in_EDX;
  undefined8 *in_RSI;
  float in_EDI;
  int in_R8D;
  int in_R9D;
  float fVar6;
  double dVar7;
  undefined8 uVar8;
  Vector3f VVar9;
  void *in_stack_00000008;
  int phiBin;
  int thetaBin;
  Point2f coords;
  Vector3f wiL;
  optional<pbrt::BSDFSample> bs;
  Point2f sample;
  Float u;
  int i;
  Vector3f wi;
  Float factorPhi;
  Float factorTheta;
  int *in_stack_fffffffffffffe58;
  RNG *in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffea8;
  int local_118;
  int local_114 [3];
  int local_108;
  int local_104 [3];
  uint local_f8;
  float local_f4;
  ulong local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  ulong local_c0;
  float local_b8;
  undefined4 local_b0;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined4 local_80;
  optional local_78 [44];
  BxDFReflTransFlags in_stack_ffffffffffffffb4;
  TransportMode in_stack_ffffffffffffffb8;
  Float in_stack_ffffffffffffffbc;
  int iVar10;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffffc8;
  
  memset(in_stack_00000008,0,(long)(in_R8D * in_R9D) << 2);
  pbrt::Vector3<float>::Vector3((Vector3<float> *)0x52c8bc);
  iVar10 = 0;
  do {
    if (in_ECX <= iVar10) {
      return;
    }
    fVar6 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe60);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe60);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe60);
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffe60,
               (float)((ulong)in_stack_fffffffffffffe58 >> 0x20),SUB84(in_stack_fffffffffffffe58,0))
    ;
    local_98 = *(undefined4 *)(in_RSI + 1);
    local_a0 = *in_RSI;
    VVar9.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_ECX;
    VVar9.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_R8D;
    VVar9.super_Tuple3<pbrt::Vector3,_float>.z = in_EDX;
    local_88 = local_a0;
    local_80 = local_98;
    pbrt::BSDF::Sample_f
              ((BSDF *)CONCAT44(iVar10,fVar6),VVar9,in_stack_ffffffffffffffbc,
               (Point2f)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb4);
    bVar2 = pstd::optional::operator_cast_to_bool(local_78);
    if (bVar2) {
      pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x52c9eb);
      bVar2 = pbrt::BSDFSample::IsSpecular((BSDFSample *)0x52c9fc);
      if (bVar2) goto LAB_0052ca0c;
      fVar6 = in_EDI;
      pBVar3 = pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x52ca5c);
      local_d8 = (pBVar3->wi).super_Tuple3<pbrt::Vector3,_float>.z;
      local_e0._0_4_ = (pBVar3->wi).super_Tuple3<pbrt::Vector3,_float>.x;
      local_e0._4_4_ = (pBVar3->wi).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar8 = 0;
      v.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
      v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffea8;
      v.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      local_d0 = local_e0;
      local_c8 = local_d8;
      VVar9 = pbrt::BSDF::RenderToLocal
                        ((BSDF *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),v);
      in_stack_fffffffffffffe94 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar1._8_8_ = uVar8;
      auVar1._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_f0 = vmovlpd_avx(auVar1);
      local_e8 = in_stack_fffffffffffffe94;
      local_c0 = local_f0;
      local_b8 = in_stack_fffffffffffffe94;
      in_stack_fffffffffffffe90 = pbrt::SafeACos(0.0);
      std::atan2((double)(local_c0 >> 0x20),(double)(local_c0 & 0xffffffff));
      pbrt::Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffe60,
                 (float)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 SUB84(in_stack_fffffffffffffe58,0));
      if (local_f4 < 0.0) {
        local_f4 = ((float)in_R9D / 6.2831855) * 6.2831855 + local_f4;
      }
      local_104[1] = 0;
      dVar7 = std::floor((double)(ulong)local_f8);
      local_104[0] = (int)SUB84(dVar7,0);
      piVar4 = std::max<int>(local_104 + 1,local_104);
      local_108 = in_R8D + -1;
      piVar4 = std::min<int>(piVar4,&local_108);
      local_104[2] = *piVar4;
      local_114[1] = 0;
      dVar7 = std::floor((double)(ulong)(uint)local_f4);
      local_114[0] = (int)SUB84(dVar7,0);
      in_stack_fffffffffffffe60 = (RNG *)std::max<int>(local_114 + 1,local_114);
      local_118 = in_R9D + -1;
      in_stack_fffffffffffffe58 = std::min<int>((int *)in_stack_fffffffffffffe60,&local_118);
      local_114[2] = *in_stack_fffffffffffffe58;
      lVar5 = (long)(local_104[2] * in_R9D + local_114[2]);
      *(float *)((long)in_stack_00000008 + lVar5 * 4) =
           *(float *)((long)in_stack_00000008 + lVar5 * 4) + 1.0;
      local_b0 = 0;
    }
    else {
LAB_0052ca0c:
      local_b0 = 4;
    }
    pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x52ccfd);
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void FrequencyTable(const BSDF* bsdf, const Vector3f& wo, RNG& rng, int sampleCount,
                    int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = thetaRes / Pi, factorPhi = phiRes / (2 * Pi);

    Vector3f wi;
    for (int i = 0; i < sampleCount; ++i) {
        Float u = rng.Uniform<Float>();
        Point2f sample{rng.Uniform<Float>(), rng.Uniform<Float>()};
        pstd::optional<BSDFSample> bs = bsdf->Sample_f(wo, u, sample);

        if (!bs || bs->IsSpecular())
            continue;

        Vector3f wiL = bsdf->RenderToLocal(bs->wi);

        Point2f coords(SafeACos(wiL.z) * factorTheta,
                       std::atan2(wiL.y, wiL.x) * factorPhi);

        if (coords.y < 0)
            coords.y += 2 * Pi * factorPhi;

        int thetaBin = std::min(std::max(0, (int)std::floor(coords.x)), thetaRes - 1);
        int phiBin = std::min(std::max(0, (int)std::floor(coords.y)), phiRes - 1);

        target[thetaBin * phiRes + phiBin] += 1;
    }
}